

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChElementHexaANCF_3843.cpp
# Opt level: O1

void __thiscall
chrono::fea::ChElementHexaANCF_3843::PrecomputeInternalForceMatricesWeightsContInt
          (ChElementHexaANCF_3843 *this)

{
  undefined1 auVar1 [64];
  undefined1 auVar2 [64];
  undefined1 auVar3 [64];
  undefined1 auVar4 [64];
  undefined1 auVar5 [64];
  undefined1 auVar6 [64];
  undefined1 auVar7 [64];
  undefined1 auVar8 [64];
  undefined1 auVar9 [64];
  undefined1 auVar10 [64];
  undefined1 auVar11 [64];
  undefined1 auVar12 [64];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  long lVar16;
  undefined1 (*pauVar17) [64];
  Scalar *pSVar18;
  double *pdVar19;
  long lVar20;
  double *pdVar21;
  double *pdVar22;
  long lVar23;
  int iVar24;
  Scalar SVar25;
  long lVar26;
  ulong uVar27;
  ActualDstType actualDst;
  ulong uVar28;
  undefined1 auVar29 [16];
  undefined1 auVar30 [64];
  undefined1 auVar31 [64];
  undefined1 auVar32 [64];
  undefined1 auVar33 [64];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  ChMatrix33<double> J_0xi;
  ChMatrixNM<double,_NSF,_3> SD_precompute_D;
  MatrixNx3c Sxi_D;
  Scalar aSStack_b80 [23];
  undefined8 uStack_ac8;
  assign_op<double,_double> local_aa1;
  Scalar local_aa0;
  ulong local_a98;
  ChElementHexaANCF_3843 *local_a90;
  Matrix3xN *local_a88;
  Scalar local_a80;
  ulong local_a78;
  ulong local_a70;
  double local_a68;
  double local_a60;
  double local_a58;
  MatrixNx3c *local_a50;
  SrcXprType local_a48;
  Matrix<double,_3,_3,_1,_3,_3> local_a40;
  MatrixNx3c *local_9e8;
  Matrix<double,_3,_3,_1,_3,_3> local_9e0;
  MatrixNx3c *local_998;
  Matrix<double,_3,_3,_1,_3,_3> *local_990;
  undefined8 local_988;
  Scalar local_980 [24];
  undefined1 local_8c0 [64];
  Scalar aSStack_880 [32];
  Scalar aSStack_780 [32];
  double local_680;
  double local_678;
  Scalar local_670 [94];
  MatrixNx3c local_380;
  
  uStack_ac8 = 0x718752;
  Eigen::DenseStorage<double,_-1,_-1,_-1,_1>::resize
            ((DenseStorage<double,__1,__1,__1,_1> *)&this->m_SD,0x1800,0x20,0xc0);
  uStack_ac8 = 0x71876d;
  Eigen::DenseStorage<double,_-1,_-1,_-1,_0>::resize
            ((DenseStorage<double,__1,__1,__1,_0> *)&this->m_kGQ,0x40,0x40,1);
  if (*(long *)(DAT_00b92c40 + 0x50) != *(long *)(DAT_00b92c40 + 0x48)) {
    local_a88 = &this->m_ebar0;
    local_aa0 = 0.0;
    local_a90 = this;
    do {
      iVar24 = SUB84(local_aa0,0);
      if (*(long *)(DAT_00b92c40 + 0x50) != *(long *)(DAT_00b92c40 + 0x48)) {
        local_a98 = 0;
        SVar25 = local_aa0;
        local_a80 = local_aa0;
        do {
          lVar16 = *(long *)(DAT_00b92c40 + 0x48);
          lVar26 = *(long *)(DAT_00b92c40 + 0x50) - lVar16;
          local_a78 = local_a98;
          if (lVar26 != 0) {
            uVar27 = lVar26 >> 3;
            uVar28 = 0;
            do {
              lVar26 = *(long *)(static_tables_3843 + 0x48);
              local_a58 = *(double *)(lVar26 + (long)local_aa0 * 8);
              local_a60 = *(double *)(lVar26 + local_a98 * 8);
              local_a68 = *(double *)(lVar26 + uVar28 * 8);
              lVar26 = uVar27 * (long)local_aa0 + local_a98;
              uStack_ac8 = 0x71885c;
              local_a70 = uVar28;
              Calc_Sxi_D(this,&local_380,*(double *)(lVar16 + (long)local_aa0 * 8),
                         *(double *)(lVar16 + local_a98 * 8),*(double *)(lVar16 + uVar28 * 8));
              local_a40.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.
              m_data.array[0] = 0.0;
              local_a40.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.
              m_data.array[1] = 0.0;
              local_a40.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.
              m_data.array[2] = 0.0;
              local_a40.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.
              m_data.array[3] = 0.0;
              local_a40.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.
              m_data.array[4] = 0.0;
              local_a40.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.
              m_data.array[5] = 0.0;
              local_a40.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.
              m_data.array[6] = 0.0;
              local_a40.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.
              m_data.array[7] = 0.0;
              local_a40.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.
              m_data.array[8] = 0.0;
              local_980[0] = 1.0;
              uStack_ac8 = 0x7188a9;
              Eigen::internal::
              generic_product_impl<Eigen::Matrix<double,3,32,1,3,32>,Eigen::Matrix<double,32,3,0,32,3>,Eigen::DenseShape,Eigen::DenseShape,8>
              ::scaleAndAddTo<Eigen::Matrix<double,3,3,1,3,3>>
                        (&local_a40,local_a88,&local_380,local_980);
              uStack_ac8 = 0x7188d5;
              local_a50 = &local_380;
              local_a48.m_xpr = &local_a40;
              local_9e8 = &local_380;
              Eigen::internal::
              Assignment<Eigen::Matrix<double,_3,_3,_1,_3,_3>,_Eigen::Inverse<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>,_Eigen::internal::assign_op<double,_double>,_Eigen::internal::Dense2Dense,_void>
              ::run(&local_9e0,&local_a48,&local_aa1);
              local_998 = local_9e8;
              local_988 = 3;
              auVar1 = *(undefined1 (*) [64])
                        (local_9e8->super_PlainObjectBase<Eigen::Matrix<double,_32,_3,_0,_32,_3>_>).
                        m_storage.m_data.array;
              auVar2 = *(undefined1 (*) [64])
                        ((local_9e8->super_PlainObjectBase<Eigen::Matrix<double,_32,_3,_0,_32,_3>_>)
                         .m_storage.m_data.array + 8);
              auVar3 = *(undefined1 (*) [64])
                        ((local_9e8->super_PlainObjectBase<Eigen::Matrix<double,_32,_3,_0,_32,_3>_>)
                         .m_storage.m_data.array + 0x10);
              auVar4 = *(undefined1 (*) [64])
                        ((local_9e8->super_PlainObjectBase<Eigen::Matrix<double,_32,_3,_0,_32,_3>_>)
                         .m_storage.m_data.array + 0x18);
              auVar5 = *(undefined1 (*) [64])
                        ((local_9e8->super_PlainObjectBase<Eigen::Matrix<double,_32,_3,_0,_32,_3>_>)
                         .m_storage.m_data.array + 0x20);
              auVar6 = *(undefined1 (*) [64])
                        ((local_9e8->super_PlainObjectBase<Eigen::Matrix<double,_32,_3,_0,_32,_3>_>)
                         .m_storage.m_data.array + 0x40);
              auVar7 = *(undefined1 (*) [64])
                        ((local_9e8->super_PlainObjectBase<Eigen::Matrix<double,_32,_3,_0,_32,_3>_>)
                         .m_storage.m_data.array + 0x28);
              auVar8 = *(undefined1 (*) [64])
                        ((local_9e8->super_PlainObjectBase<Eigen::Matrix<double,_32,_3,_0,_32,_3>_>)
                         .m_storage.m_data.array + 0x48);
              auVar9 = *(undefined1 (*) [64])
                        ((local_9e8->super_PlainObjectBase<Eigen::Matrix<double,_32,_3,_0,_32,_3>_>)
                         .m_storage.m_data.array + 0x30);
              auVar10 = *(undefined1 (*) [64])
                         ((local_9e8->super_PlainObjectBase<Eigen::Matrix<double,_32,_3,_0,_32,_3>_>
                          ).m_storage.m_data.array + 0x50);
              auVar11 = *(undefined1 (*) [64])
                         ((local_9e8->super_PlainObjectBase<Eigen::Matrix<double,_32,_3,_0,_32,_3>_>
                          ).m_storage.m_data.array + 0x38);
              auVar12 = *(undefined1 (*) [64])
                         ((local_9e8->super_PlainObjectBase<Eigen::Matrix<double,_32,_3,_0,_32,_3>_>
                          ).m_storage.m_data.array + 0x58);
              lVar16 = 7;
              pauVar17 = &local_8c0;
              do {
                auVar29._8_8_ = 0;
                auVar29._0_8_ =
                     local_a40.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.
                     m_storage.m_data.array[lVar16 + 5];
                auVar30 = vbroadcastsd_avx512f(auVar29);
                auVar31 = vmulpd_avx512f(auVar1,auVar30);
                auVar13._8_8_ = 0;
                auVar13._0_8_ =
                     local_a40.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.
                     m_storage.m_data.array[lVar16 + 8];
                auVar32 = vbroadcastsd_avx512f(auVar13);
                auVar14._8_8_ = 0;
                auVar14._0_8_ =
                     local_9e0.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.
                     m_storage.m_data.array[lVar16 + -1];
                auVar33 = vbroadcastsd_avx512f(auVar14);
                auVar31 = vfmadd231pd_avx512f(auVar31,auVar5,auVar32);
                auVar31 = vfmadd231pd_avx512f(auVar31,auVar6,auVar33);
                pauVar17[-3] = auVar31;
                auVar31 = vmulpd_avx512f(auVar2,auVar30);
                auVar31 = vfmadd231pd_avx512f(auVar31,auVar7,auVar32);
                auVar31 = vfmadd231pd_avx512f(auVar31,auVar8,auVar33);
                pauVar17[-2] = auVar31;
                auVar31 = vmulpd_avx512f(auVar3,auVar30);
                auVar31 = vfmadd231pd_avx512f(auVar31,auVar9,auVar32);
                auVar31 = vfmadd231pd_avx512f(auVar31,auVar10,auVar33);
                pauVar17[-1] = auVar31;
                auVar30 = vmulpd_avx512f(auVar4,auVar30);
                auVar30 = vfmadd231pd_avx512f(auVar30,auVar11,auVar32);
                auVar30 = vfmadd231pd_avx512f(auVar30,auVar12,auVar33);
                *pauVar17 = auVar30;
                lVar16 = lVar16 + 1;
                pauVar17 = pauVar17 + 4;
              } while (lVar16 != 10);
              lVar16 = 0x40;
              pSVar18 = local_670;
              do {
                pSVar18[-2] = aSStack_b80[lVar16];
                pSVar18[-1] = (&local_a80)[lVar16];
                *pSVar18 = local_980[lVar16];
                lVar16 = lVar16 + 1;
                pSVar18 = pSVar18 + 3;
              } while (lVar16 != 0x60);
              lVar16 = lVar26 * uVar27 + uVar28;
              local_990 = &local_9e0;
              if ((lVar16 < 0) ||
                 (lVar26 = (local_a90->m_kGQ).
                           super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                           m_storage.m_cols *
                           (local_a90->m_kGQ).
                           super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                           m_storage.m_rows, lVar26 - lVar16 == 0 || lVar26 < lVar16)) {
                uStack_ac8 = 0x718cbf;
                __assert_fail("index >= 0 && index < size()",
                              "/usr/include/eigen3/Eigen/src/Core/DenseCoeffsBase.h",0x1ab,
                              "Scalar &Eigen::DenseCoeffsBase<Eigen::Matrix<double, -1, -1>, 1>::operator()(Index) [Derived = Eigen::Matrix<double, -1, -1>, Level = 1]"
                             );
              }
              auVar34._8_8_ = 0;
              auVar34._0_8_ =
                   local_a40.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.
                   m_data.array[3];
              auVar36._8_8_ = 0;
              auVar36._0_8_ =
                   local_a40.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.
                   m_data.array[4];
              auVar38._8_8_ = 0;
              auVar38._0_8_ =
                   local_a40.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.
                   m_data.array[8];
              auVar40._8_8_ = 0;
              auVar40._0_8_ =
                   local_a40.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.
                   m_data.array[7];
              auVar41._8_8_ = 0;
              auVar41._0_8_ =
                   local_a40.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.
                   m_data.array[7] *
                   local_a40.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.
                   m_data.array[5];
              auVar29 = vfmsub231sd_fma(auVar41,auVar36,auVar38);
              auVar39._8_8_ = 0;
              auVar39._0_8_ =
                   local_a40.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.
                   m_data.array[6] *
                   local_a40.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.
                   m_data.array[5];
              auVar13 = vfmsub231sd_fma(auVar39,auVar34,auVar38);
              auVar37._8_8_ = 0;
              auVar37._0_8_ =
                   local_a40.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.
                   m_data.array[6] *
                   local_a40.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.
                   m_data.array[4];
              auVar14 = vfmsub231sd_fma(auVar37,auVar34,auVar40);
              auVar15._8_8_ = 0x8000000000000000;
              auVar15._0_8_ = 0x8000000000000000;
              auVar35._8_8_ = 0;
              auVar35._0_8_ =
                   auVar14._0_8_ *
                   local_a40.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.
                   m_data.array[2] +
                   (auVar29._0_8_ *
                    local_a40.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage
                    .m_data.array[0] -
                   auVar13._0_8_ *
                   local_a40.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.
                   m_data.array[1]);
              auVar29 = vxorpd_avx512vl(auVar35,auVar15);
              (local_a90->m_kGQ).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
              m_storage.m_data[lVar16] = local_a60 * local_a58 * local_a68 * auVar29._0_8_;
              pdVar19 = (local_a90->m_SD).
                        super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.m_storage.
                        m_data;
              lVar26 = (local_a90->m_SD).
                       super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.m_storage.
                       m_rows;
              if (lVar26 < 0 && pdVar19 != (double *)0x0) {
                uStack_ac8 = 0x718ce1;
                __assert_fail("(dataPtr == 0) || ( rows >= 0 && (RowsAtCompileTime == Dynamic || RowsAtCompileTime == rows) && cols >= 0 && (ColsAtCompileTime == Dynamic || ColsAtCompileTime == cols))"
                              ,"/usr/include/eigen3/Eigen/src/Core/MapBase.h",0xb2,
                              "Eigen::MapBase<Eigen::Block<Eigen::Matrix<double, -1, -1, 1>, -1, 1>, 0>::MapBase(PointerType, Index, Index) [Derived = Eigen::Block<Eigen::Matrix<double, -1, -1, 1>, -1, 1>, Level = 0]"
                             );
              }
              lVar23 = (local_a90->m_SD).
                       super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.m_storage.
                       m_cols;
              if (lVar23 <= lVar16) {
LAB_00718c7b:
                uStack_ac8 = 0x718c9d;
                __assert_fail("(i>=0) && ( ((BlockRows==1) && (BlockCols==XprType::ColsAtCompileTime) && i<xpr.rows()) ||((BlockRows==XprType::RowsAtCompileTime) && (BlockCols==1) && i<xpr.cols()))"
                              ,"/usr/include/eigen3/Eigen/src/Core/Block.h",0x7a,
                              "Eigen::Block<Eigen::Matrix<double, -1, -1, 1>, -1, 1>::Block(XprType &, Index) [XprType = Eigen::Matrix<double, -1, -1, 1>, BlockRows = -1, BlockCols = 1, InnerPanel = false]"
                             );
              }
              if (lVar26 != 0x20) {
                uStack_ac8 = 0x718d03;
                __assert_fail("rows == this->rows() && cols == this->cols() && \"DenseBase::resize() does not actually allow one to resize.\""
                              ,"/usr/include/eigen3/Eigen/src/Core/DenseBase.h",0x106,
                              "void Eigen::DenseBase<Eigen::Block<Eigen::Matrix<double, -1, -1, 1>, -1, 1>>::resize(Index, Index) [Derived = Eigen::Block<Eigen::Matrix<double, -1, -1, 1>, -1, 1>]"
                             );
              }
              lVar20 = ((long)local_a80 * uVar27 + local_a78) * uVar27 + local_a70;
              pdVar21 = pdVar19 + lVar20;
              pdVar22 = &local_680;
              lVar26 = 0x20;
              do {
                *pdVar21 = *pdVar22;
                pdVar22 = pdVar22 + 3;
                pdVar21 = pdVar21 + lVar23;
                lVar26 = lVar26 + -1;
              } while (lVar26 != 0);
              if ((lVar16 + 0x40 < 0) ||
                 (lVar26 = (local_a90->m_SD).
                           super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.
                           m_storage.m_cols, lVar26 <= lVar16 + 0x40)) goto LAB_00718c7b;
              pdVar22 = pdVar19 + lVar20 + 0x40;
              pdVar21 = &local_678;
              lVar23 = 0x20;
              do {
                *pdVar22 = *pdVar21;
                pdVar21 = pdVar21 + 3;
                pdVar22 = pdVar22 + lVar26;
                lVar23 = lVar23 + -1;
              } while (lVar23 != 0);
              if ((lVar16 + 0x80 < 0) ||
                 (lVar26 = (local_a90->m_SD).
                           super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.
                           m_storage.m_cols, lVar26 <= lVar16 + 0x80)) goto LAB_00718c7b;
              pdVar19 = pdVar19 + lVar20 + 0x80;
              pdVar21 = local_670;
              lVar16 = 0x20;
              do {
                *pdVar19 = *pdVar21;
                pdVar21 = pdVar21 + 3;
                pdVar19 = pdVar19 + lVar26;
                lVar16 = lVar16 + -1;
              } while (lVar16 != 0);
              uVar28 = (ulong)((int)local_a70 + 1);
              lVar16 = *(long *)(DAT_00b92c40 + 0x48);
              uVar27 = *(long *)(DAT_00b92c40 + 0x50) - lVar16 >> 3;
              this = local_a90;
              SVar25 = local_a80;
            } while (uVar28 < uVar27);
          }
          iVar24 = SUB84(SVar25,0);
          local_a98 = (ulong)((int)local_a78 + 1);
        } while (local_a98 <
                 (ulong)(*(long *)(DAT_00b92c40 + 0x50) - *(long *)(DAT_00b92c40 + 0x48) >> 3));
      }
      local_aa0 = (Scalar)(ulong)(iVar24 + 1);
    } while ((ulong)local_aa0 <
             (ulong)(*(long *)(DAT_00b92c40 + 0x50) - *(long *)(DAT_00b92c40 + 0x48) >> 3));
  }
  return;
}

Assistant:

void ChElementHexaANCF_3843::PrecomputeInternalForceMatricesWeightsContInt() {
    ChQuadratureTables* GQTable = GetStaticGQTables();
    unsigned int GQ_idx_xi_eta_zeta = NP - 1;  // Gauss-Quadrature table index for xi, eta, and zeta

    m_SD.resize(NSF, 3 * NIP);
    m_kGQ.resize(NIP, 1);

    ChMatrixNM<double, NSF, 3> SD_precompute_D;

    for (unsigned int it_xi = 0; it_xi < GQTable->Lroots[GQ_idx_xi_eta_zeta].size(); it_xi++) {
        for (unsigned int it_eta = 0; it_eta < GQTable->Lroots[GQ_idx_xi_eta_zeta].size(); it_eta++) {
            for (unsigned int it_zeta = 0; it_zeta < GQTable->Lroots[GQ_idx_xi_eta_zeta].size(); it_zeta++) {
                double GQ_weight = GQTable->Weight[GQ_idx_xi_eta_zeta][it_xi] *
                                   GQTable->Weight[GQ_idx_xi_eta_zeta][it_eta] *
                                   GQTable->Weight[GQ_idx_xi_eta_zeta][it_zeta];
                double xi = GQTable->Lroots[GQ_idx_xi_eta_zeta][it_xi];
                double eta = GQTable->Lroots[GQ_idx_xi_eta_zeta][it_eta];
                double zeta = GQTable->Lroots[GQ_idx_xi_eta_zeta][it_zeta];
                auto index =
                    it_zeta + it_eta * GQTable->Lroots[GQ_idx_xi_eta_zeta].size() +
                    it_xi * GQTable->Lroots[GQ_idx_xi_eta_zeta].size() * GQTable->Lroots[GQ_idx_xi_eta_zeta].size();
                ChMatrix33<double>
                    J_0xi;         // Element Jacobian between the reference configuration and normalized configuration
                MatrixNx3c Sxi_D;  // Matrix of normalized shape function derivatives

                Calc_Sxi_D(Sxi_D, xi, eta, zeta);
                J_0xi.noalias() = m_ebar0 * Sxi_D;

                // Adjust the shape function derivative matrix to account for a potentially deformed reference state
                SD_precompute_D = Sxi_D * J_0xi.inverse();
                m_kGQ(index) = -J_0xi.determinant() * GQ_weight;

                // Group all of the columns together in blocks across the entire element
                m_SD.col(index) = SD_precompute_D.col(0);
                m_SD.col(index + NIP) = SD_precompute_D.col(1);
                m_SD.col(index + 2 * NIP) = SD_precompute_D.col(2);

                index++;
            }
        }
    }
}